

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Document::ReadObjects(Document *this)

{
  _Rb_tree_header *p_Var1;
  pointer *ppuVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_00;
  Scope *pSVar3;
  undefined8 *puVar4;
  _Base_ptr p_Var5;
  iterator __position;
  int iVar6;
  const_iterator cVar7;
  mapped_type pLVar8;
  mapped_type *ppLVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  Element *pEVar14;
  uint64_t id;
  char *err;
  key_type local_78;
  allocator<char> local_51;
  unsigned_long local_50;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_48;
  ObjectMap *local_40;
  char *local_38;
  
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)(this->parser->root)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
               _M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
               .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Objects","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,&local_78);
  if (cVar7._M_node == &(this_00->_M_impl).super__Rb_tree_header._M_header) {
    pEVar14 = (Element *)0x0;
  }
  else {
    pEVar14 = *(Element **)(cVar7._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((pEVar14 == (Element *)0x0) ||
     ((pEVar14->compound)._M_t.
      super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
      super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
      super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl == (Scope *)0x0)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"no Objects dictionary found","");
    Util::DOMError(&local_78,(Element *)0x0);
  }
  pLVar8 = (mapped_type)operator_new(0x28);
  pLVar8->doc = this;
  pLVar8->element = pEVar14;
  local_40 = &this->objects;
  (pLVar8->object)._M_t.
  super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
  .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)0x0;
  pLVar8->id = 0;
  pLVar8->flags = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  ppLVar9 = std::
            map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
            ::operator[](local_40,(key_type_conflict1 *)&local_78);
  *ppLVar9 = pLVar8;
  pSVar3 = (pEVar14->compound)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
           super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  p_Var10 = *(_Base_ptr *)((long)&(pSVar3->elements)._M_t + 0x18);
  p_Var13 = (_Base_ptr)((long)&(pSVar3->elements)._M_t + 8);
  if (p_Var10 != p_Var13) {
    p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    local_48 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->animationStacks;
    do {
      puVar4 = *(undefined8 **)(*(long *)(p_Var10 + 2) + 8);
      if (puVar4 == *(undefined8 **)(*(long *)(p_Var10 + 2) + 0x10)) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"expected ID after object key","");
        Util::DOMError(&local_78,*(Element **)(p_Var10 + 2));
      }
      local_50 = ParseTokenAsID((Token *)*puVar4,&local_38);
      if (local_38 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,local_38,&local_51);
        Util::DOMError(&local_78,*(Element **)(p_Var10 + 2));
      }
      if (local_50 == 0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"encountered object with implicitly defined id 0","");
        Util::DOMError(&local_78,*(Element **)(p_Var10 + 2));
      }
      p_Var5 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < local_50]) {
        if (*(ulong *)(p_Var5 + 1) >= local_50) {
          p_Var11 = p_Var5;
        }
      }
      p_Var12 = p_Var1;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var12 = (_Rb_tree_header *)p_Var11,
         local_50 < ((_Rb_tree_header *)p_Var11)->_M_node_count)) {
        p_Var12 = p_Var1;
      }
      if (p_Var12 != p_Var1) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"encountered duplicate object id, ignoring first occurrence",
                   "");
        Util::DOMWarning(&local_78,*(Element **)(p_Var10 + 2));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pLVar8 = (mapped_type)operator_new(0x28);
      pEVar14 = *(Element **)(p_Var10 + 2);
      pLVar8->doc = this;
      pLVar8->element = pEVar14;
      (pLVar8->object)._M_t.
      super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
      .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)0x0;
      pLVar8->id = local_50;
      pLVar8->flags = 0;
      ppLVar9 = std::
                map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
                ::operator[](local_40,&local_50);
      *ppLVar9 = pLVar8;
      iVar6 = strcmp(*(char **)(p_Var10 + 1),"AnimationStack");
      if (iVar6 == 0) {
        __position._M_current =
             (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->animationStacks).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_48,__position,&local_50);
        }
        else {
          *__position._M_current = local_50;
          ppuVar2 = &(this->animationStacks).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var13);
  }
  return;
}

Assistant:

void Document::ReadObjects()
{
    // read ID objects from "Objects" section
    const Scope& sc = parser.GetRootScope();
    const Element* const eobjects = sc["Objects"];
    if(!eobjects || !eobjects->Compound()) {
        DOMError("no Objects dictionary found");
    }

    // add a dummy entry to represent the Model::RootNode object (id 0),
    // which is only indirectly defined in the input file
    objects[0] = new LazyObject(0L, *eobjects, *this);

    const Scope& sobjects = *eobjects->Compound();
    for(const ElementMap::value_type& el : sobjects.Elements()) {

        // extract ID
        const TokenList& tok = el.second->Tokens();

        if (tok.empty()) {
            DOMError("expected ID after object key",el.second);
        }

        const char* err;
        const uint64_t id = ParseTokenAsID(*tok[0], err);
        if(err) {
            DOMError(err,el.second);
        }

        // id=0 is normally implicit
        if(id == 0L) {
            DOMError("encountered object with implicitly defined id 0",el.second);
        }

        if(objects.find(id) != objects.end()) {
            DOMWarning("encountered duplicate object id, ignoring first occurrence",el.second);
        }

        objects[id] = new LazyObject(id, *el.second, *this);

        // grab all animation stacks upfront since there is no listing of them
        if(!strcmp(el.first.c_str(),"AnimationStack")) {
            animationStacks.push_back(id);
        }
    }
}